

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

CharsMap * sentencepiece::normalizer::Builder::BuildNFKCMap(CharsMap *chars_map)

{
  int iVar1;
  ulong in_RAX;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = sentencepiece::logging::GetMinLogLevel();
  if (iVar1 < 3) {
    uStack_18 = uStack_18 & 0xffffffffffffff;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"builder.cc",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x167);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LOG(",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ERROR",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"NFK compile is not enabled. rebuild with -DSPM_ENABLE_NFKC_COMPILE=ON",0x45);
    error::Die::~Die((Die *)((long)&uStack_18 + 7));
  }
  sentencepiece::util::Status::Status((Status *)chars_map);
  return chars_map;
}

Assistant:

util::Status Builder::BuildNFKCMap(CharsMap *chars_map) {
#ifdef ENABLE_NFKC_COMPILE
  LOG(INFO) << "Running BuildNFKCMap";
  BuildMapInternal(chars_map, ToNFKC, ToNFKD);
#else
  LOG(ERROR) << kCompileError;
#endif

  return util::OkStatus();
}